

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

Variable * __thiscall
rsg::VariableManager::allocate(VariableManager *this,VariableType *type,Storage storage,char *name)

{
  ValueEntry *local_50;
  ValueEntry *valueEntry;
  Variable *variable;
  ValueScope *pVStack_38;
  int numScalars;
  ValueScope *valueScope;
  VariableScope *varScope;
  char *name_local;
  VariableType *pVStack_18;
  Storage storage_local;
  VariableType *type_local;
  VariableManager *this_local;
  
  varScope = (VariableScope *)name;
  name_local._4_4_ = storage;
  pVStack_18 = type;
  type_local = (VariableType *)this;
  valueScope = (ValueScope *)getCurVariableScope(this);
  pVStack_38 = getCurValueScope(this);
  variable._4_4_ = VariableType::getScalarSize(pVStack_18);
  valueEntry = (ValueEntry *)
               VariableScope::allocate
                         ((VariableScope *)valueScope,pVStack_18,STORAGE_LOCAL,(char *)varScope);
  local_50 = ValueScope::allocate(pVStack_38,(Variable *)valueEntry);
  std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::push_back
            (&this->m_entryCache,&local_50);
  this->m_numAllocatedScalars = variable._4_4_ + this->m_numAllocatedScalars;
  setStorage(this,(Variable *)valueEntry,name_local._4_4_);
  return (Variable *)valueEntry;
}

Assistant:

Variable* VariableManager::allocate (const VariableType& type, Variable::Storage storage, const char* name)
{
	VariableScope&	varScope	= getCurVariableScope();
	ValueScope&		valueScope	= getCurValueScope();
	int				numScalars	= type.getScalarSize();

	// Allocate in current scope
	Variable* variable = varScope.allocate(type, Variable::STORAGE_LOCAL, name);

	// Allocate value entry
	ValueEntry* valueEntry = valueScope.allocate(variable);

	// Add to cache
	m_entryCache.push_back(valueEntry);

	m_numAllocatedScalars += numScalars;

	// Set actual storage - affects uniform/shader in allocations.
	setStorage(variable, storage);

	return variable;
}